

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O1

void __thiscall
RasterizerA3<16u>::_renderImpl<CompositorScalar,true>(RasterizerA3<16u> *this,uint32_t argb32)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong *puVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ulong local_80;
  ulong local_78;
  
  uVar17 = (ulong)(int)*(uint *)(this + 0x40);
  uVar1 = *(uint *)(this + 0x44);
  if (*(uint *)(this + 0x40) <= uVar1) {
    lVar2 = *(long *)(*(long *)(this + 8) + 8);
    iVar11 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
    iVar5 = (argb32 >> 8 & 0xff | 0xff0000) * (argb32 >> 0x18);
    uVar15 = (iVar5 + 0x800080U >> 8 & 0xff00ff) + iVar5 + 0x800080;
    uVar9 = (iVar11 + 0x800080U >> 8 & 0xff00ff) + iVar11 + 0x800080 >> 8 & 0xff00ff;
    lVar21 = lVar2 * uVar17 + *(long *)(*(long *)(this + 8) + 0x10);
    lVar19 = *(long *)(this + 0x58) * uVar17 * 8 + *(long *)(this + 0x60);
    puVar14 = (ulong *)(*(long *)(this + 0x48) * uVar17 * 8 + *(long *)(this + 0x50));
    uVar20 = uVar15 & 0xff00ff00 | uVar9;
    uVar15 = uVar15 >> 8 & 0xff00ff;
    do {
      lVar6 = *(long *)(this + 0x48);
      uVar16 = 0;
      uVar4 = 0;
      local_80 = 0;
      do {
        local_78 = *puVar14;
        *puVar14 = 0;
        if (local_78 != 0) {
          do {
            lVar3 = 0;
            if (local_78 != 0) {
              for (; (local_78 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            uVar18 = -1L << ((byte)lVar3 & 0x3f);
            uVar7 = (uint)((int)lVar3 << 4) | local_80;
            uVar8 = uVar4;
            if (uVar4 < uVar7) {
              uVar12 = -uVar16;
              if (0 < (int)uVar16) {
                uVar12 = uVar16;
              }
              if (0xfe < (int)uVar12) {
                uVar12 = 0xff;
              }
              uVar8 = uVar7;
              if ((char)uVar12 != '\0') {
                if ((uVar12 & 0xff) == 0xff) {
                  do {
                    *(uint *)(lVar21 + uVar4 * 4) = uVar20;
                    uVar4 = uVar4 + 1;
                  } while (uVar4 < uVar7);
                }
                else {
                  do {
                    uVar13 = *(uint *)(lVar21 + uVar4 * 4);
                    uVar10 = (uVar13 & 0xff00ff) * (uVar12 ^ 0xff) + uVar12 * uVar9 + 0x800080;
                    uVar13 = (uVar13 >> 8 & 0xff00ff) * (uVar12 ^ 0xff) + uVar12 * uVar15 + 0x800080
                    ;
                    *(uint *)(lVar21 + uVar4 * 4) =
                         (uVar10 >> 8 & 0xff00ff) + uVar10 >> 8 & 0xff00ff |
                         (uVar13 >> 8 & 0xff00ff) + uVar13 & 0xff00ff00;
                    uVar4 = uVar4 + 1;
                  } while (uVar4 < uVar7);
                }
              }
            }
            uVar7 = uVar18 ^ local_78;
            if (local_78 == uVar18) {
              uVar4 = (long)*(int *)(this + 0x30);
              local_78 = uVar7;
              if (local_80 + 0x400 < (ulong)(long)*(int *)(this + 0x30)) {
                uVar4 = local_80 + 0x400;
              }
            }
            else {
              lVar3 = 0;
              if (uVar7 != 0) {
                for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              uVar4 = (uint)((int)lVar3 << 4) | local_80;
              local_78 = -1L << ((byte)lVar3 & 0x3f) ^ uVar7;
            }
            if (uVar8 < uVar4) {
              do {
                uVar16 = uVar16 + *(int *)(lVar19 + uVar8 * 8);
                uVar13 = uVar16 - (*(int *)(lVar19 + 4 + uVar8 * 8) >> 9);
                uVar12 = -uVar13;
                if (0 < (int)uVar13) {
                  uVar12 = uVar13;
                }
                *(undefined8 *)(lVar19 + uVar8 * 8) = 0;
                uVar13 = uVar20;
                if (uVar12 < 0xff) {
                  uVar13 = *(uint *)(lVar21 + uVar8 * 4);
                  iVar11 = uVar12 * uVar9 + (uVar13 & 0xff00ff) * (0xff - uVar12);
                  iVar5 = uVar12 * uVar15 + (0xff - uVar12) * (uVar13 >> 8 & 0xff00ff);
                  uVar13 = (iVar11 + 0x800080U >> 8 & 0xff00ff) + iVar11 + 0x800080 >> 8 & 0xff00ff
                           | iVar5 + (iVar5 + 0x800080U >> 8 & 0xff00ff) + 0x800080 & 0xff00ff00;
                }
                *(uint *)(lVar21 + uVar8 * 4) = uVar13;
                uVar8 = uVar8 + 1;
              } while (uVar4 != uVar8);
            }
          } while (local_78 != 0);
        }
        local_80 = local_80 + 0x400;
        puVar14 = puVar14 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      uVar8 = (ulong)*(int *)(this + 0x30);
      if (uVar4 < uVar8) {
        uVar12 = -uVar16;
        if (0 < (int)uVar16) {
          uVar12 = uVar16;
        }
        if (0xfe < (int)uVar12) {
          uVar12 = 0xff;
        }
        if ((char)uVar12 != '\0') {
          if ((uVar12 & 0xff) == 0xff) {
            if (uVar4 < uVar8) {
              do {
                *(uint *)(lVar21 + uVar4 * 4) = uVar20;
                uVar4 = uVar4 + 1;
              } while (uVar8 != uVar4);
            }
          }
          else if (uVar4 < uVar8) {
            do {
              uVar16 = *(uint *)(lVar21 + uVar4 * 4);
              uVar13 = (uVar16 & 0xff00ff) * (uVar12 ^ 0xff) + uVar12 * uVar9 + 0x800080;
              uVar16 = (uVar16 >> 8 & 0xff00ff) * (uVar12 ^ 0xff) + uVar12 * uVar15 + 0x800080;
              *(uint *)(lVar21 + uVar4 * 4) =
                   (uVar13 >> 8 & 0xff00ff) + uVar13 >> 8 & 0xff00ff |
                   (uVar16 >> 8 & 0xff00ff) + uVar16 & 0xff00ff00;
              uVar4 = uVar4 + 1;
            } while (uVar8 != uVar4);
          }
        }
      }
      lVar21 = lVar21 + lVar2;
      lVar19 = lVar19 + *(long *)(this + 0x58) * 8;
      uVar17 = uVar17 + 1;
    } while (uVar17 <= (ulong)(long)(int)uVar1);
  }
  *(undefined8 *)(this + 0x40) = 0x7fffffff;
  return;
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}